

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O0

void __thiscall tensor_t<float>::tensor_t(tensor_t<float> *this,tensor_t<float> *other)

{
  long in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *in_stack_00000068;
  vector<float,_std::allocator<float>_> *in_stack_00000070;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x104eb5);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  std::vector<float,_std::allocator<float>_>::operator=(in_stack_00000070,in_stack_00000068);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  return;
}

Assistant:

tensor_t(const tensor_t &other) {
    data = other.data;
    size = other.size;
  }